

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgsrfs.c
# Opt level: O2

void cgsrfs(trans_t trans,SuperMatrix *A,SuperMatrix *L,SuperMatrix *U,int *perm_c,int *perm_r,
           char *equed,float *R,float *C,SuperMatrix *B,SuperMatrix *X,float *ferr,float *berr,
           SuperLUStat_t *stat,int *info)

{
  float *est;
  float fVar1;
  char cVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  void *pvVar6;
  double dVar7;
  void *pvVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  int iVar14;
  singlecomplex *psVar15;
  int iVar16;
  long lVar17;
  bool bVar18;
  bool bVar19;
  float fVar20;
  double dVar21;
  char transc [1];
  int local_24c;
  double local_248;
  singlecomplex *local_240;
  void *local_238;
  double local_230;
  float local_224;
  trans_t local_220;
  uint local_21c;
  float local_218;
  int kase;
  int nrow;
  int ione;
  ulong local_208;
  singlecomplex *local_200;
  singlecomplex *local_1f8;
  ulong local_1f0;
  int *local_1e8;
  long local_1e0;
  float local_1d4;
  singlecomplex *local_1d0;
  SuperMatrix *local_1c8;
  SuperMatrix *local_1c0;
  int *local_1b8;
  double local_1b0;
  int *local_1a8;
  long local_1a0;
  long local_198;
  singlecomplex *local_190;
  singlecomplex *local_188;
  singlecomplex done;
  SuperMatrix local_178;
  long local_158;
  long local_150;
  singlecomplex *local_148;
  double local_140;
  int isave [3];
  
  ione = 1;
  nrow = A->nrow;
  done.r = 1.0;
  done.i = 0.0;
  pvVar6 = A->Store;
  lVar12 = *(long *)((long)pvVar6 + 8);
  psVar15 = *(singlecomplex **)((long)B->Store + 8);
  local_188 = *(singlecomplex **)((long)X->Store + 8);
  iVar16 = *B->Store;
  iVar3 = *X->Store;
  lVar10 = (long)iVar3;
  uVar4 = B->ncol;
  uVar13 = (ulong)uVar4;
  *info = 0;
  local_1c8 = U;
  local_1c0 = L;
  if (CONJ < trans) {
    iVar9 = 1;
    iVar14 = -1;
LAB_001042e2:
    *info = iVar14;
    local_24c = iVar9;
    input_error("cgsrfs",&local_24c);
    return;
  }
  uVar5 = A->nrow;
  iVar9 = 2;
  iVar14 = -2;
  local_1a0 = lVar10;
  local_190 = psVar15;
  if (((((int)uVar5 < 0) || (uVar5 != A->ncol)) || (A->Stype != SLU_NC)) ||
     ((A->Dtype != SLU_C || (A->Mtype != SLU_GE)))) goto LAB_001042e2;
  iVar9 = 3;
  iVar14 = -3;
  local_1e0 = lVar12;
  local_1a8 = perm_c;
  if ((((L->nrow < 0) || ((L->nrow != L->ncol || (L->Stype != SLU_SC)))) || (L->Dtype != SLU_C)) ||
     (L->Mtype != SLU_TRLU)) goto LAB_001042e2;
  iVar9 = 4;
  iVar14 = -4;
  if ((((U->nrow < 0) || (U->nrow != U->ncol)) || (U->Stype != SLU_NC)) ||
     ((U->Dtype != SLU_C || (U->Mtype != SLU_TRU)))) goto LAB_001042e2;
  iVar9 = 10;
  iVar14 = -10;
  local_1f0 = uVar13;
  local_1b8 = perm_r;
  if (((iVar16 < (int)uVar5) || ((B->Stype != SLU_DN || (B->Dtype != SLU_C)))) ||
     (B->Mtype != SLU_GE)) goto LAB_001042e2;
  iVar9 = 0xb;
  iVar14 = -0xb;
  if ((((iVar3 < (int)uVar5) || (X->Stype != SLU_DN)) || (X->Dtype != SLU_C)) ||
     (X->Mtype != SLU_GE)) goto LAB_001042e2;
  if (uVar4 == 0 || (ulong)uVar5 == 0) {
    uVar11 = 0;
    if ((int)uVar4 < 1) {
      uVar13 = uVar11;
    }
    for (; uVar13 != uVar11; uVar11 = uVar11 + 1) {
      ferr[uVar11] = 0.0;
      berr[uVar11] = 0.0;
    }
    return;
  }
  cVar2 = *equed;
  bVar18 = true;
  if (cVar2 != 'R') {
    bVar18 = cVar2 == 'B';
    bVar19 = true;
    if (cVar2 == 'C') goto LAB_00104469;
  }
  bVar19 = cVar2 == 'B';
LAB_00104469:
  local_240 = singlecomplexMalloc((ulong)uVar5 * 2);
  local_238 = superlu_malloc((long)A->nrow << 2);
  local_1e8 = int32Malloc(A->nrow);
  if ((local_238 == (void *)0x0 || local_240 == (singlecomplex *)0x0) || local_1e8 == (int *)0x0) {
    sprintf((char *)isave,"%s at line %d in file %s\n","Malloc fails for work/rwork/iwork.",0xe3,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/cgsrfs.c");
    superlu_abort_and_exit((char *)isave);
  }
  if (trans == NOTRANS) {
    transc[0] = 'N';
    local_220 = TRANS;
  }
  else {
    if (trans == TRANS) {
      transc[0] = 'T';
    }
    else {
      transc[0] = 'C';
    }
    local_220 = NOTRANS;
  }
  local_198 = (long)iVar16;
  local_248 = (double)CONCAT44(local_248._4_4_,A->ncol + 1);
  local_218 = smach("Epsilon");
  local_224 = smach("Safe minimum");
  local_224 = (float)(int)local_248._0_4_ * local_224;
  for (lVar12 = 0; (int)lVar12 < A->nrow; lVar12 = lVar12 + 1) {
    local_1e8[lVar12] = 0;
  }
  lVar12 = 0;
  if (trans == NOTRANS) {
    while (lVar12 < A->ncol) {
      lVar17 = *(long *)((long)pvVar6 + 0x18);
      lVar10 = lVar12 * 4;
      lVar12 = lVar12 + 1;
      for (lVar10 = (long)*(int *)(lVar17 + lVar10); local_24c = (int)lVar10,
          local_24c < *(int *)(lVar17 + lVar12 * 4); lVar10 = lVar10 + 1) {
        local_1e8[*(int *)(*(long *)((long)pvVar6 + 0x10) + lVar10 * 4)] =
             local_1e8[*(int *)(*(long *)((long)pvVar6 + 0x10) + lVar10 * 4)] + 1;
      }
    }
  }
  else {
    for (; lVar12 < A->ncol; lVar12 = lVar12 + 1) {
      local_1e8[lVar12] =
           *(int *)(*(long *)((long)pvVar6 + 0x18) + 4 + lVar12 * 4) -
           *(int *)(*(long *)((long)pvVar6 + 0x18) + lVar12 * 4);
    }
  }
  local_178.Stype = B->Stype;
  local_178.Dtype = B->Dtype;
  local_178.Mtype = B->Mtype;
  local_178.nrow = B->nrow;
  local_178.ncol = 1;
  local_178.Store = superlu_malloc(0x10);
  if ((int *)local_178.Store == (int *)0x0) {
    sprintf((char *)isave,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for Bjcol.Store",0x10c,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/cgsrfs.c");
    superlu_abort_and_exit((char *)isave);
  }
  *(int *)local_178.Store = iVar16;
  *(singlecomplex **)((long)local_178.Store + 8) = local_240;
  local_1b0 = (double)local_224;
  bVar19 = (bool)(trans == NOTRANS & bVar19);
  bVar18 = (bool)(bVar18 & trans != NOTRANS);
  iVar16 = (int)local_1f0;
  local_1f0 = local_1f0 & 0xffffffff;
  if (iVar16 < 1) {
    local_1f0 = 0;
  }
  local_224 = local_224 / local_218;
  local_150 = local_198 * 8;
  local_158 = local_1a0 * 8;
  local_1f8 = local_188;
  local_1d0 = local_190;
  local_208 = 0;
LAB_001046e4:
  if (local_208 == local_1f0) {
    superlu_free(local_240);
    superlu_free(local_238);
    superlu_free(local_1e8);
    superlu_free(local_178.Store);
    return;
  }
  local_148 = local_190 + local_208 * local_198;
  local_200 = local_188 + local_208 * local_1a0;
  local_21c = 0;
  local_1d4 = 3.0;
  do {
    psVar15 = local_240;
    ccopy_(&nrow,local_148,&ione,local_240,&ione);
    sp_cgemv(transc,(singlecomplex)0xbf800000,A,local_200,ione,done,psVar15,ione);
    pvVar8 = local_238;
    psVar15 = local_1d0;
    for (lVar12 = 0; (int)lVar12 < A->nrow; lVar12 = lVar12 + 1) {
      dVar21 = c_abs1(psVar15);
      *(float *)((long)pvVar8 + lVar12 * 4) = (float)dVar21;
      psVar15 = psVar15 + 1;
    }
    if (trans == NOTRANS) {
      lVar12 = 0;
      while (lVar12 < A->ncol) {
        dVar21 = c_abs1(local_200 + lVar12);
        lVar10 = *(long *)((long)pvVar6 + 0x18);
        lVar17 = (long)*(int *)(lVar10 + lVar12 * 4);
        lVar12 = lVar12 + 1;
        psVar15 = (singlecomplex *)(local_1e0 + lVar17 * 8);
        for (; local_24c = (int)lVar17, local_24c < *(int *)(lVar10 + lVar12 * 4);
            lVar17 = lVar17 + 1) {
          dVar7 = c_abs1(psVar15);
          lVar10 = (long)*(int *)(*(long *)((long)pvVar6 + 0x10) + lVar17 * 4);
          *(float *)((long)local_238 + lVar10 * 4) =
               (float)(dVar7 * (double)(float)dVar21 +
                      (double)*(float *)((long)local_238 + lVar10 * 4));
          lVar10 = *(long *)((long)pvVar6 + 0x18);
          psVar15 = psVar15 + 1;
        }
      }
    }
    else {
      lVar12 = local_1e0;
      dVar21 = 0.0;
      while ((long)dVar21 < (long)A->ncol) {
        lVar10 = *(long *)((long)pvVar6 + 0x18);
        lVar17 = (long)*(int *)(lVar10 + (long)dVar21 * 4);
        local_230 = (double)((long)dVar21 + 1);
        psVar15 = (singlecomplex *)(lVar12 + lVar17 * 8);
        fVar20 = 0.0;
        local_140 = dVar21;
        for (; local_24c = (int)lVar17, local_24c < *(int *)(lVar10 + (long)local_230 * 4);
            lVar17 = lVar17 + 1) {
          iVar16 = *(int *)(*(long *)((long)pvVar6 + 0x10) + lVar17 * 4);
          local_248 = c_abs1(psVar15);
          dVar21 = c_abs1(local_200 + iVar16);
          fVar20 = (float)(dVar21 * local_248 + (double)fVar20);
          lVar10 = *(long *)((long)pvVar6 + 0x18);
          psVar15 = psVar15 + 1;
          lVar12 = local_1e0;
        }
        *(float *)((long)local_238 + (long)local_140 * 4) =
             fVar20 + *(float *)((long)local_238 + (long)local_140 * 4);
        dVar21 = local_230;
      }
    }
    pvVar8 = local_238;
    fVar20 = 0.0;
    lVar12 = 0;
    psVar15 = local_240;
    while( true ) {
      local_24c = (int)lVar12;
      iVar16 = A->nrow;
      if (iVar16 <= local_24c) break;
      fVar1 = *(float *)((long)pvVar8 + lVar12 * 4);
      if (fVar1 <= local_224) {
        if ((fVar1 != 0.0) || (NAN(fVar1))) {
          local_248 = (double)fVar20;
          dVar21 = c_abs1(psVar15);
          if (local_248 <= (dVar21 + local_1b0) / (double)*(float *)((long)pvVar8 + lVar12 * 4)) {
            dVar21 = c_abs1(psVar15);
            dVar21 = dVar21 + local_1b0;
            goto LAB_001049ce;
          }
        }
      }
      else {
        local_248 = (double)fVar20;
        dVar21 = c_abs1(psVar15);
        if (local_248 <= dVar21 / (double)*(float *)((long)pvVar8 + lVar12 * 4)) {
          dVar21 = c_abs1(psVar15);
LAB_001049ce:
          fVar20 = (float)(dVar21 / (double)*(float *)((long)pvVar8 + lVar12 * 4));
        }
      }
      lVar12 = lVar12 + 1;
      psVar15 = psVar15 + 1;
    }
    berr[local_208] = fVar20;
    if (((fVar20 <= local_218) || (local_1d4 < fVar20 + fVar20)) || (4 < local_21c)) break;
    cgstrs(trans,local_1c0,local_1c8,local_1a8,local_1b8,&local_178,stat,info);
    caxpy_(&nrow,&done,local_240,&ione,local_200,&ione);
    local_1d4 = berr[local_208];
    local_21c = local_21c + 1;
  } while( true );
  stat->RefineSteps = local_21c;
  psVar15 = local_1d0;
  for (lVar12 = 0; (int)lVar12 < iVar16; lVar12 = lVar12 + 1) {
    dVar21 = c_abs1(psVar15);
    *(float *)((long)local_238 + lVar12 * 4) = (float)dVar21;
    iVar16 = A->nrow;
    psVar15 = psVar15 + 1;
  }
  if (trans == NOTRANS) {
    lVar12 = 0;
    while (lVar12 < A->ncol) {
      dVar21 = c_abs1(local_200 + lVar12);
      lVar10 = *(long *)((long)pvVar6 + 0x18);
      lVar17 = (long)*(int *)(lVar10 + lVar12 * 4);
      lVar12 = lVar12 + 1;
      psVar15 = (singlecomplex *)(local_1e0 + lVar17 * 8);
      for (; local_24c = (int)lVar17, local_24c < *(int *)(lVar10 + lVar12 * 4); lVar17 = lVar17 + 1
          ) {
        dVar7 = c_abs1(psVar15);
        lVar10 = (long)*(int *)(*(long *)((long)pvVar6 + 0x10) + lVar17 * 4);
        *(float *)((long)local_238 + lVar10 * 4) =
             (float)(dVar7 * (double)(float)dVar21 +
                    (double)*(float *)((long)local_238 + lVar10 * 4));
        lVar10 = *(long *)((long)pvVar6 + 0x18);
        psVar15 = psVar15 + 1;
      }
    }
  }
  else {
    local_230 = 0.0;
    while ((long)local_230 < (long)A->ncol) {
      lVar12 = *(long *)((long)pvVar6 + 0x18);
      lVar10 = (long)*(int *)(lVar12 + (long)local_230 * 4);
      dVar21 = (double)((long)local_230 + 1);
      psVar15 = (singlecomplex *)(local_1e0 + lVar10 * 8);
      fVar20 = 0.0;
      for (; local_24c = (int)lVar10, local_24c < *(int *)(lVar12 + (long)dVar21 * 4);
          lVar10 = lVar10 + 1) {
        dVar7 = c_abs1(local_200 + *(int *)(*(long *)((long)pvVar6 + 0x10) + lVar10 * 4));
        local_248 = (double)CONCAT44(local_248._4_4_,(float)dVar7);
        dVar7 = c_abs1(psVar15);
        fVar20 = (float)((double)local_248._0_4_ * dVar7 + (double)fVar20);
        lVar12 = *(long *)((long)pvVar6 + 0x18);
        psVar15 = psVar15 + 1;
      }
      *(float *)((long)local_238 + (long)local_230 * 4) =
           fVar20 + *(float *)((long)local_238 + (long)local_230 * 4);
      local_230 = dVar21;
    }
  }
  psVar15 = local_240;
  for (lVar12 = 0; pvVar8 = local_238, (int)lVar12 < A->nrow; lVar12 = lVar12 + 1) {
    fVar20 = *(float *)((long)local_238 + lVar12 * 4);
    dVar21 = c_abs(psVar15);
    dVar21 = (double)((float)(local_1e8[lVar12] + 1) * local_218 *
                     *(float *)((long)pvVar8 + lVar12 * 4)) + dVar21;
    if (fVar20 <= local_224) {
      dVar21 = dVar21 + local_1b0;
    }
    *(float *)((long)local_238 + lVar12 * 4) = (float)dVar21;
    psVar15 = psVar15 + 1;
  }
  kase = 0;
  est = ferr + local_208;
  do {
    clacon2_(&nrow,local_240 + A->nrow,local_240,est,&kase,isave);
    psVar15 = local_240;
    if (kase == 1) {
      if (bVar19) {
        uVar13 = (ulong)(uint)A->ncol;
        if (A->ncol < 1) {
          uVar13 = 0;
        }
        for (uVar11 = 0; uVar13 != uVar11; uVar11 = uVar11 + 1) {
          local_240[uVar11].r = local_240[uVar11].r * C[uVar11];
          local_240[uVar11].i = local_240[uVar11].i * C[uVar11];
        }
      }
      else if (bVar18) {
        uVar13 = (ulong)(uint)A->nrow;
        if (A->nrow < 1) {
          uVar13 = 0;
        }
        for (uVar11 = 0; uVar13 != uVar11; uVar11 = uVar11 + 1) {
          local_240[uVar11].r = local_240[uVar11].r * R[uVar11];
          local_240[uVar11].i = local_240[uVar11].i * R[uVar11];
        }
      }
      cgstrs(local_220,local_1c0,local_1c8,local_1a8,local_1b8,&local_178,stat,info);
      uVar13 = (ulong)(uint)A->nrow;
      if (A->nrow < 1) {
        uVar13 = 0;
      }
      for (uVar11 = 0; uVar13 != uVar11; uVar11 = uVar11 + 1) {
        psVar15[uVar11].r = psVar15[uVar11].r * *(float *)((long)local_238 + uVar11 * 4);
        psVar15[uVar11].i = psVar15[uVar11].i * *(float *)((long)local_238 + uVar11 * 4);
      }
LAB_00104f71:
      local_24c = (int)uVar13;
    }
    else {
      if (kase == 0) break;
      uVar13 = (ulong)(uint)A->nrow;
      if (A->nrow < 1) {
        uVar13 = 0;
      }
      for (uVar11 = 0; uVar13 != uVar11; uVar11 = uVar11 + 1) {
        local_240[uVar11].r = local_240[uVar11].r * *(float *)((long)local_238 + uVar11 * 4);
        local_240[uVar11].i = local_240[uVar11].i * *(float *)((long)local_238 + uVar11 * 4);
      }
      local_24c = (int)uVar13;
      cgstrs(trans,local_1c0,local_1c8,local_1a8,local_1b8,&local_178,stat,info);
      if (bVar19) {
        uVar13 = (ulong)(uint)A->ncol;
        if (A->ncol < 1) {
          uVar13 = 0;
        }
        for (uVar11 = 0; uVar13 != uVar11; uVar11 = uVar11 + 1) {
          local_240[uVar11].r = local_240[uVar11].r * C[uVar11];
          local_240[uVar11].i = local_240[uVar11].i * C[uVar11];
        }
        goto LAB_00104f71;
      }
      if (bVar18) {
        uVar13 = (ulong)(uint)A->ncol;
        if (A->ncol < 1) {
          uVar13 = 0;
        }
        for (uVar11 = 0; uVar13 != uVar11; uVar11 = uVar11 + 1) {
          local_240[uVar11].r = local_240[uVar11].r * R[uVar11];
          local_240[uVar11].i = local_240[uVar11].i * R[uVar11];
        }
        goto LAB_00104f71;
      }
    }
  } while (kase != 0);
  if (bVar19) {
    fVar20 = 0.0;
    psVar15 = local_1f8;
    for (lVar12 = 0; local_24c = (int)lVar12, local_24c < A->nrow; lVar12 = lVar12 + 1) {
      local_248 = (double)fVar20;
      local_230 = (double)C[lVar12];
      dVar21 = c_abs1(psVar15);
      if (local_248 <= dVar21 * local_230) {
        fVar20 = C[lVar12];
        dVar21 = c_abs1(psVar15);
        fVar20 = (float)(dVar21 * (double)fVar20);
      }
      psVar15 = psVar15 + 1;
    }
  }
  else if (bVar18) {
    fVar20 = 0.0;
    psVar15 = local_1f8;
    for (lVar12 = 0; local_24c = (int)lVar12, local_24c < A->nrow; lVar12 = lVar12 + 1) {
      local_248 = (double)fVar20;
      local_230 = (double)R[lVar12];
      dVar21 = c_abs1(psVar15);
      if (local_248 <= dVar21 * local_230) {
        fVar20 = R[lVar12];
        dVar21 = c_abs1(psVar15);
        fVar20 = (float)(dVar21 * (double)fVar20);
      }
      psVar15 = psVar15 + 1;
    }
  }
  else {
    fVar20 = 0.0;
    psVar15 = local_1f8;
    for (iVar16 = 0; local_24c = iVar16, iVar16 < A->nrow; iVar16 = iVar16 + 1) {
      local_248 = (double)fVar20;
      dVar21 = c_abs1(psVar15);
      if (local_248 <= dVar21) {
        dVar21 = c_abs1(psVar15);
        fVar20 = (float)dVar21;
      }
      psVar15 = psVar15 + 1;
    }
  }
  if ((fVar20 != 0.0) || (NAN(fVar20))) {
    *est = *est / fVar20;
  }
  local_208 = local_208 + 1;
  local_1d0 = (singlecomplex *)((long)&local_1d0->r + local_150);
  local_1f8 = (singlecomplex *)((long)&local_1f8->r + local_158);
  goto LAB_001046e4;
}

Assistant:

void
cgsrfs(trans_t trans, SuperMatrix *A, SuperMatrix *L, SuperMatrix *U,
       int *perm_c, int *perm_r, char *equed, float *R, float *C,
       SuperMatrix *B, SuperMatrix *X, float *ferr, float *berr,
       SuperLUStat_t *stat, int *info)
{


#define ITMAX 5
    
    /* Table of constant values */
    int    ione = 1, nrow = A->nrow;
    singlecomplex ndone = {-1., 0.};
    singlecomplex done = {1., 0.};
    
    /* Local variables */
    NCformat *Astore;
    singlecomplex   *Aval;
    SuperMatrix Bjcol;
    DNformat *Bstore, *Xstore, *Bjcol_store;
    singlecomplex   *Bmat, *Xmat, *Bptr, *Xptr;
    int      kase;
    float   safe1, safe2;
    int      i, j, k, irow, nz, count, notran, rowequ, colequ;
    int      ldb, ldx, nrhs;
    float   s, xk, lstres, eps, safmin;
    char     transc[1];
    trans_t  transt;
    singlecomplex   *work;
    float   *rwork;
    int      *iwork;
    int      isave[3];

    extern int clacon2_(int *, singlecomplex *, singlecomplex *, float *, int *, int []);

    Astore = A->Store;
    Aval   = Astore->nzval;
    Bstore = B->Store;
    Xstore = X->Store;
    Bmat   = Bstore->nzval;
    Xmat   = Xstore->nzval;
    ldb    = Bstore->lda;
    ldx    = Xstore->lda;
    nrhs   = B->ncol;
    
    /* Test the input parameters */
    *info = 0;
    notran = (trans == NOTRANS);
    if ( !notran && trans != TRANS && trans != CONJ ) *info = -1;
    else if ( A->nrow != A->ncol || A->nrow < 0 ||
	      A->Stype != SLU_NC || A->Dtype != SLU_C || A->Mtype != SLU_GE )
	*info = -2;
    else if ( L->nrow != L->ncol || L->nrow < 0 ||
 	      L->Stype != SLU_SC || L->Dtype != SLU_C || L->Mtype != SLU_TRLU )
	*info = -3;
    else if ( U->nrow != U->ncol || U->nrow < 0 ||
 	      U->Stype != SLU_NC || U->Dtype != SLU_C || U->Mtype != SLU_TRU )
	*info = -4;
    else if ( ldb < SUPERLU_MAX(0, A->nrow) ||
 	      B->Stype != SLU_DN || B->Dtype != SLU_C || B->Mtype != SLU_GE )
        *info = -10;
    else if ( ldx < SUPERLU_MAX(0, A->nrow) ||
 	      X->Stype != SLU_DN || X->Dtype != SLU_C || X->Mtype != SLU_GE )
	*info = -11;
    if (*info != 0) {
	i = -(*info);
	input_error("cgsrfs", &i);
	return;
    }

    /* Quick return if possible */
    if ( A->nrow == 0 || nrhs == 0) {
	for (j = 0; j < nrhs; ++j) {
	    ferr[j] = 0.;
	    berr[j] = 0.;
	}
	return;
    }

    rowequ = strncmp(equed, "R", 1)==0 || strncmp(equed, "B", 1)==0;
    colequ = strncmp(equed, "C", 1)==0 || strncmp(equed, "B", 1)==0;
    
    /* Allocate working space */
    work = singlecomplexMalloc(2*A->nrow);
    rwork = (float *) SUPERLU_MALLOC( A->nrow * sizeof(float) );
    iwork = int32Malloc(A->nrow);
    if ( !work || !rwork || !iwork ) 
        ABORT("Malloc fails for work/rwork/iwork.");
    
    if ( notran ) {
	*(unsigned char *)transc = 'N';
        transt = TRANS;
    } else if ( trans == TRANS ) {
	*(unsigned char *)transc = 'T';
	transt = NOTRANS;
    } else if ( trans == CONJ ) {
	*(unsigned char *)transc = 'C';
	transt = NOTRANS;
    }    

    /* NZ = maximum number of nonzero elements in each row of A, plus 1 */
    nz     = A->ncol + 1;
    eps    = smach("Epsilon");
    safmin = smach("Safe minimum");

    /* Set SAFE1 essentially to be the underflow threshold times the
       number of additions in each row. */
    safe1  = nz * safmin;
    safe2  = safe1 / eps;

    /* Compute the number of nonzeros in each row (or column) of A */
    for (i = 0; i < A->nrow; ++i) iwork[i] = 0;
    if ( notran ) {
	for (k = 0; k < A->ncol; ++k)
	    for (i = Astore->colptr[k]; i < Astore->colptr[k+1]; ++i) 
		++iwork[Astore->rowind[i]];
    } else {
	for (k = 0; k < A->ncol; ++k)
	    iwork[k] = Astore->colptr[k+1] - Astore->colptr[k];
    }	

    /* Copy one column of RHS B into Bjcol. */
    Bjcol.Stype = B->Stype;
    Bjcol.Dtype = B->Dtype;
    Bjcol.Mtype = B->Mtype;
    Bjcol.nrow  = B->nrow;
    Bjcol.ncol  = 1;
    Bjcol.Store = (void *) SUPERLU_MALLOC( sizeof(DNformat) );
    if ( !Bjcol.Store ) ABORT("SUPERLU_MALLOC fails for Bjcol.Store");
    Bjcol_store = Bjcol.Store;
    Bjcol_store->lda = ldb;
    Bjcol_store->nzval = work; /* address aliasing */
	
    /* Do for each right hand side ... */
    for (j = 0; j < nrhs; ++j) {
	count = 0;
	lstres = 3.;
	Bptr = &Bmat[j*ldb];
	Xptr = &Xmat[j*ldx];

	while (1) { /* Loop until stopping criterion is satisfied. */

	    /* Compute residual R = B - op(A) * X,   
	       where op(A) = A, A**T, or A**H, depending on TRANS. */
	    
#ifdef _CRAY
	    CCOPY(&nrow, Bptr, &ione, work, &ione);
#else
	    ccopy_(&nrow, Bptr, &ione, work, &ione);
#endif
	    sp_cgemv(transc, ndone, A, Xptr, ione, done, work, ione);

	    /* Compute componentwise relative backward error from formula 
	       max(i) ( abs(R(i)) / ( abs(op(A))*abs(X) + abs(B) )(i) )   
	       where abs(Z) is the componentwise absolute value of the matrix
	       or vector Z.  If the i-th component of the denominator is less
	       than SAFE2, then SAFE1 is added to the i-th component of the   
	       numerator before dividing. */

	    for (i = 0; i < A->nrow; ++i) rwork[i] = c_abs1( &Bptr[i] );
	    
	    /* Compute abs(op(A))*abs(X) + abs(B). */
	    if ( notran ) {
		for (k = 0; k < A->ncol; ++k) {
		    xk = c_abs1( &Xptr[k] );
		    for (i = Astore->colptr[k]; i < Astore->colptr[k+1]; ++i)
			rwork[Astore->rowind[i]] += c_abs1(&Aval[i]) * xk;
		}
	    } else {  /* trans = TRANS or CONJ */
		for (k = 0; k < A->ncol; ++k) {
		    s = 0.;
		    for (i = Astore->colptr[k]; i < Astore->colptr[k+1]; ++i) {
			irow = Astore->rowind[i];
			s += c_abs1(&Aval[i]) * c_abs1(&Xptr[irow]);
		    }
		    rwork[k] += s;
		}
	    }
	    s = 0.;
	    for (i = 0; i < A->nrow; ++i) {
		if (rwork[i] > safe2) {
		    s = SUPERLU_MAX( s, c_abs1(&work[i]) / rwork[i] );
                } else if ( rwork[i] != 0.0 ) {
		    s = SUPERLU_MAX( s, (c_abs1(&work[i]) + safe1) / rwork[i] );
                }
                /* If rwork[i] is exactly 0.0, then we know the true 
                   residual also must be exactly 0.0. */
	    }
	    berr[j] = s;

	    /* Test stopping criterion. Continue iterating if   
	       1) The residual BERR(J) is larger than machine epsilon, and   
	       2) BERR(J) decreased by at least a factor of 2 during the   
	          last iteration, and   
	       3) At most ITMAX iterations tried. */

	    if (berr[j] > eps && berr[j] * 2. <= lstres && count < ITMAX) {
		/* Update solution and try again. */
		cgstrs (trans, L, U, perm_c, perm_r, &Bjcol, stat, info);
		
#ifdef _CRAY
		CAXPY(&nrow, &done, work, &ione,
		       &Xmat[j*ldx], &ione);
#else
		caxpy_(&nrow, &done, work, &ione,
		       &Xmat[j*ldx], &ione);
#endif
		lstres = berr[j];
		++count;
	    } else {
		break;
	    }
        
	} /* end while */

	stat->RefineSteps = count;

	/* Bound error from formula:
	   norm(X - XTRUE) / norm(X) .le. FERR = norm( abs(inv(op(A)))*   
	   ( abs(R) + NZ*EPS*( abs(op(A))*abs(X)+abs(B) ))) / norm(X)   
          where   
            norm(Z) is the magnitude of the largest component of Z   
            inv(op(A)) is the inverse of op(A)   
            abs(Z) is the componentwise absolute value of the matrix or
	       vector Z   
            NZ is the maximum number of nonzeros in any row of A, plus 1   
            EPS is machine epsilon   

          The i-th component of abs(R)+NZ*EPS*(abs(op(A))*abs(X)+abs(B))   
          is incremented by SAFE1 if the i-th component of   
          abs(op(A))*abs(X) + abs(B) is less than SAFE2.   

          Use CLACON2 to estimate the infinity-norm of the matrix   
             inv(op(A)) * diag(W),   
          where W = abs(R) + NZ*EPS*( abs(op(A))*abs(X)+abs(B) ))) */
	
	for (i = 0; i < A->nrow; ++i) rwork[i] = c_abs1( &Bptr[i] );
	
	/* Compute abs(op(A))*abs(X) + abs(B). */
	if ( notran ) {
	    for (k = 0; k < A->ncol; ++k) {
		xk = c_abs1( &Xptr[k] );
		for (i = Astore->colptr[k]; i < Astore->colptr[k+1]; ++i)
		    rwork[Astore->rowind[i]] += c_abs1(&Aval[i]) * xk;
	    }
	} else {  /* trans == TRANS or CONJ */
	    for (k = 0; k < A->ncol; ++k) {
		s = 0.;
		for (i = Astore->colptr[k]; i < Astore->colptr[k+1]; ++i) {
		    irow = Astore->rowind[i];
		    xk = c_abs1( &Xptr[irow] );
		    s += c_abs1(&Aval[i]) * xk;
		}
		rwork[k] += s;
	    }
	}
	
	for (i = 0; i < A->nrow; ++i)
	    if (rwork[i] > safe2)
		rwork[i] = c_abs(&work[i]) + (iwork[i]+1)*eps*rwork[i];
	    else
		rwork[i] = c_abs(&work[i])+(iwork[i]+1)*eps*rwork[i]+safe1;
	kase = 0;

	do {
	    clacon2_(&nrow, &work[A->nrow], work, &ferr[j], &kase, isave);
	    if (kase == 0) break;

	    if (kase == 1) {
		/* Multiply by diag(W)*inv(op(A)**T)*(diag(C) or diag(R)). */
		if ( notran && colequ )
		    for (i = 0; i < A->ncol; ++i) {
		        cs_mult(&work[i], &work[i], C[i]);
	            }
		else if ( !notran && rowequ )
		    for (i = 0; i < A->nrow; ++i) {
		        cs_mult(&work[i], &work[i], R[i]);
                    }

		cgstrs (transt, L, U, perm_c, perm_r, &Bjcol, stat, info);
		
		for (i = 0; i < A->nrow; ++i) {
		    cs_mult(&work[i], &work[i], rwork[i]);
	 	}
	    } else {
		/* Multiply by (diag(C) or diag(R))*inv(op(A))*diag(W). */
		for (i = 0; i < A->nrow; ++i) {
		    cs_mult(&work[i], &work[i], rwork[i]);
		}
		
		cgstrs (trans, L, U, perm_c, perm_r, &Bjcol, stat, info);
		
		if ( notran && colequ )
		    for (i = 0; i < A->ncol; ++i) {
		        cs_mult(&work[i], &work[i], C[i]);
		    }
		else if ( !notran && rowequ )
		    for (i = 0; i < A->ncol; ++i) {
		        cs_mult(&work[i], &work[i], R[i]);  
		    }
	    }
	    
	} while ( kase != 0 );

	/* Normalize error. */
	lstres = 0.;
 	if ( notran && colequ ) {
	    for (i = 0; i < A->nrow; ++i)
	    	lstres = SUPERLU_MAX( lstres, C[i] * c_abs1( &Xptr[i]) );
  	} else if ( !notran && rowequ ) {
	    for (i = 0; i < A->nrow; ++i)
	    	lstres = SUPERLU_MAX( lstres, R[i] * c_abs1( &Xptr[i]) );
	} else {
	    for (i = 0; i < A->nrow; ++i)
	    	lstres = SUPERLU_MAX( lstres, c_abs1( &Xptr[i]) );
	}
	if ( lstres != 0. )
	    ferr[j] /= lstres;

    } /* for each RHS j ... */
    
    SUPERLU_FREE(work);
    SUPERLU_FREE(rwork);
    SUPERLU_FREE(iwork);
    SUPERLU_FREE(Bjcol.Store);

    return;

}